

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolver.cpp
# Opt level: O2

void __thiscall HighsMipSolver::callbackGetCutPool(HighsMipSolver *this)

{
  HighsCallback *pHVar1;
  HighsCallback *pHVar2;
  HighsInt HVar3;
  allocator local_d9;
  vector<double,_std::allocator<double>_> cut_upper;
  vector<double,_std::allocator<double>_> cut_lower;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  HighsSparseMatrix cut_matrix;
  
  pHVar1 = this->callback_;
  cut_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cut_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  cut_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cut_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  cut_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  cut_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  HighsSparseMatrix::HighsSparseMatrix(&cut_matrix);
  HighsLpRelaxation::getCutPool
            (&((this->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->lp,
             &(pHVar1->data_out).cutpool_num_col,&(pHVar1->data_out).cutpool_num_cut,&cut_lower,
             &cut_upper,&cut_matrix);
  HVar3 = HighsSparseMatrix::numNz(&cut_matrix);
  (pHVar1->data_out).cutpool_num_nz = HVar3;
  (pHVar1->data_out).cutpool_start =
       cut_matrix.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (pHVar1->data_out).cutpool_index =
       cut_matrix.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (pHVar1->data_out).cutpool_value =
       cut_matrix.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (pHVar1->data_out).cutpool_lower =
       cut_lower.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start;
  (pHVar1->data_out).cutpool_upper =
       cut_upper.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start;
  pHVar1 = this->callback_;
  std::__cxx11::string::string((string *)&local_a0,"MIP cut pool",&local_d9);
  pHVar2 = this->callback_;
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::operator()(&pHVar1->user_callback,7,&local_a0,&pHVar2->data_out,
               (anon_struct_16_2_bb6a87e9 *)&pHVar2->data_in,pHVar2->user_callback_data);
  std::__cxx11::string::~string((string *)&local_a0);
  HighsSparseMatrix::~HighsSparseMatrix(&cut_matrix);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&cut_upper.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&cut_lower.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void HighsMipSolver::callbackGetCutPool() const {
  assert(callback_->user_callback);
  assert(callback_->callbackActive(kCallbackMipGetCutPool));
  HighsCallbackDataOut& data_out = callback_->data_out;

  std::vector<double> cut_lower;
  std::vector<double> cut_upper;
  HighsSparseMatrix cut_matrix;

  mipdata_->lp.getCutPool(data_out.cutpool_num_col, data_out.cutpool_num_cut,
                          cut_lower, cut_upper, cut_matrix);

  data_out.cutpool_num_nz = cut_matrix.numNz();
  data_out.cutpool_start = cut_matrix.start_.data();
  data_out.cutpool_index = cut_matrix.index_.data();
  data_out.cutpool_value = cut_matrix.value_.data();
  data_out.cutpool_lower = cut_lower.data();
  data_out.cutpool_upper = cut_upper.data();
  callback_->user_callback(kCallbackMipGetCutPool, "MIP cut pool",
                           &callback_->data_out, &callback_->data_in,
                           callback_->user_callback_data);
}